

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O3

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> * __thiscall
jsoncons::jsonpath::detail::
eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
::create_json<unsigned_long&,jsoncons::semantic_tag,std::allocator<char>>
          (eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
           *this,unsigned_long *args,semantic_tag *args_1,allocator<char> *args_2)

{
  semantic_tag sVar1;
  uint64_t uVar2;
  _Head_base<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_false>
  _Var3;
  pointer *__ptr;
  __uniq_ptr_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
  local_28;
  
  _Var3._M_head_impl =
       (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)operator_new(0x10);
  uVar2 = *args;
  sVar1 = *args_1;
  *(undefined1 *)&(_Var3._M_head_impl)->field_0 = 3;
  ((_Var3._M_head_impl)->field_0).common_.tag_ = sVar1;
  ((_Var3._M_head_impl)->field_0).uint64_.val_ = uVar2;
  local_28._M_t.
  super__Tuple_impl<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
        )(tuple<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
          )_Var3._M_head_impl;
  std::
  vector<std::unique_ptr<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::default_delete<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>,std::allocator<std::unique_ptr<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::default_delete<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
  ::
  emplace_back<std::unique_ptr<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::default_delete<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
            ((vector<std::unique_ptr<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::default_delete<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>,std::allocator<std::unique_ptr<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::default_delete<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
              *)(this + 8),
             (unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
              *)&local_28);
  if ((_Tuple_impl<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
       )local_28._M_t.
        super__Tuple_impl<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_false>
        ._M_head_impl != (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x0) {
    std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
    ::operator()((default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)&local_28,
                 (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 local_28._M_t.
                 super__Tuple_impl<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
  }
  return (_Head_base<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_false>
          )_Var3._M_head_impl;
}

Assistant:

Json* create_json(Args&& ... args)
        {
            auto temp = jsoncons::make_unique<Json>(std::forward<Args>(args)...);
            Json* ptr = temp.get();
            temp_json_values_.push_back(std::move(temp));
            return ptr;
        }